

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Headers.cpp
# Opt level: O0

void __thiscall KDReports::Test::testEvenOdd(Test *this)

{
  bool bVar1;
  byte bVar2;
  pointer pRVar3;
  Header *pHVar4;
  int iVar5;
  HeaderMap *headers;
  Header *local_50;
  Header *oddHeader;
  QFlags<KDReports::HeaderLocation> local_34;
  Header *local_30;
  Header *evenHeader;
  Report report;
  unique_ptr<KDReports::ReportPrivate,_std::default_delete<KDReports::ReportPrivate>_> uStack_18;
  Test *local_10;
  Test *this_local;
  
  local_10 = this;
  KDReports::Report::Report((Report *)&evenHeader,(QObject *)0x0);
  QFlags<KDReports::HeaderLocation>::QFlags(&local_34,EvenPages);
  local_30 = (Header *)KDReports::Report::header((QFlags *)&evenHeader);
  QFlags<KDReports::HeaderLocation>::QFlags
            ((QFlags<KDReports::HeaderLocation> *)((long)&headers + 4),OddPages);
  local_50 = (Header *)KDReports::Report::header((QFlags *)&evenHeader);
  pRVar3 = std::unique_ptr<KDReports::ReportPrivate,_std::default_delete<KDReports::ReportPrivate>_>
           ::operator->(&uStack_18);
  bVar1 = QMap<QFlags<KDReports::HeaderLocation>,_KDReports::Header_*>::isEmpty
                    ((QMap<QFlags<KDReports::HeaderLocation>,_KDReports::Header_*> *)(pRVar3 + 0x78)
                    );
  bVar2 = QTest::qVerify((bool)(~bVar1 & 1),"!headers.isEmpty()","",
                         "/workspace/llm4binary/github/license_c_cmakelists/KDAB[P]KDReports/unittests/Headers/Headers.cpp"
                         ,0x34);
  if ((bVar2 & 1) != 0) {
    iVar5 = (int)(pRVar3 + 0x78);
    pHVar4 = (Header *)KDReports::HeaderMap::headerForPage(iVar5,1);
    bVar1 = QTest::qCompare<KDReports::Header>
                      (pHVar4,local_50,"headers.headerForPage(1, 2)","&oddHeader",
                       "/workspace/llm4binary/github/license_c_cmakelists/KDAB[P]KDReports/unittests/Headers/Headers.cpp"
                       ,0x35);
    if (bVar1) {
      pHVar4 = (Header *)KDReports::HeaderMap::headerForPage(iVar5,2);
      bVar1 = QTest::qCompare<KDReports::Header>
                        (pHVar4,local_30,"headers.headerForPage(2, 2)","&evenHeader",
                         "/workspace/llm4binary/github/license_c_cmakelists/KDAB[P]KDReports/unittests/Headers/Headers.cpp"
                         ,0x36);
      if (bVar1) {
        pHVar4 = (Header *)KDReports::HeaderMap::headerForPage(iVar5,1);
        bVar1 = QTest::qCompare<KDReports::Header>
                          (pHVar4,local_50,"headers.headerForPage(1, 1)","&oddHeader",
                           "/workspace/llm4binary/github/license_c_cmakelists/KDAB[P]KDReports/unittests/Headers/Headers.cpp"
                           ,0x37);
        if (bVar1) {
          pHVar4 = (Header *)KDReports::HeaderMap::headerForPage(iVar5,4);
          QTest::qCompare<KDReports::Header>
                    (pHVar4,local_30,"headers.headerForPage(4, 4)","&evenHeader",
                     "/workspace/llm4binary/github/license_c_cmakelists/KDAB[P]KDReports/unittests/Headers/Headers.cpp"
                     ,0x38);
        }
      }
    }
  }
  KDReports::Report::~Report((Report *)&evenHeader);
  return;
}

Assistant:

void testEvenOdd()
    {
        Report report;
        Header &evenHeader = report.header(EvenPages);
        Header &oddHeader = report.header(OddPages);
        HeaderMap &headers = report.d->m_headers;
        QVERIFY(!headers.isEmpty());
        QCOMPARE(headers.headerForPage(1, 2), &oddHeader);
        QCOMPARE(headers.headerForPage(2, 2), &evenHeader);
        QCOMPARE(headers.headerForPage(1, 1), &oddHeader);
        QCOMPARE(headers.headerForPage(4, 4), &evenHeader);
    }